

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *__dest;
  int iVar4;
  
  pcVar2 = (this->Buf).Data;
  if (pcVar2 != (char *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (this->Buf).Data = (char *)0x0;
  }
  iVar1 = (this->Buf).Size;
  if (iVar1 == 0) {
    iVar3 = 8;
  }
  else {
    iVar3 = iVar1 / 2 + iVar1;
  }
  iVar4 = iVar1 + 1;
  if (iVar1 + 1 < iVar3) {
    iVar4 = iVar3;
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar4,GImAllocatorUserData);
  pcVar2 = (this->Buf).Data;
  if (pcVar2 != (char *)0x0) {
    memcpy(__dest,pcVar2,(long)(this->Buf).Size);
    pcVar2 = (this->Buf).Data;
    if (pcVar2 != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar4;
  __dest[(this->Buf).Size] = '\0';
  (this->Buf).Size = (this->Buf).Size + 1;
  return;
}

Assistant:

void                clear() { Buf.clear(); Buf.push_back(0); }